

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

string * __thiscall
cmFindLibraryCommand::FindNormalLibraryDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  bool bVar1;
  string *psVar2;
  Name *pNVar3;
  string *path;
  pointer name;
  pointer name_00;
  cmFindLibraryHelper helper;
  cmFindLibraryHelper local_110;
  
  cmFindLibraryHelper::cmFindLibraryHelper
            (&local_110,(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
  name_00 = (this->super_cmFindBase).Names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (name_00 !=
      (this->super_cmFindBase).Names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
      _M_erase_at_end(&local_110.Names,
                      local_110.Names.
                      super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      cmFindLibraryHelper::AddName(&local_110,name_00);
      path = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pNVar3 = local_110.Names.
               super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (path != psVar2) {
        do {
          name = local_110.Names.
                 super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          if (local_110.Names.
              super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
              ._M_impl.super__Vector_impl_data._M_start != pNVar3) {
            do {
              bVar1 = cmFindLibraryHelper::CheckDirectoryForName(&local_110,path,name);
              if (bVar1) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)__return_storage_ptr__,local_110.BestPath._M_dataplus._M_p,
                           local_110.BestPath._M_dataplus._M_p + local_110.BestPath._M_string_length
                          );
                goto LAB_00357f35;
              }
              pNVar3 = name + 1;
              name = pNVar3;
            } while (pNVar3 != local_110.Names.
                               super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
            psVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          path = path + 1;
        } while (path != psVar2);
      }
      name_00 = name_00 + 1;
    } while (name_00 !=
             (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00357f35:
  cmFindLibraryHelper::~cmFindLibraryHelper(&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindNormalLibraryDirsPerName()
{
  // Search the entire path for each name.
  cmFindLibraryHelper helper(this->Makefile);
  for (std::vector<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end(); ++ni) {
    // Switch to searching for this name.
    helper.SetName(*ni);

    // Search every directory.
    for (std::vector<std::string>::const_iterator p =
           this->SearchPaths.begin();
         p != this->SearchPaths.end(); ++p) {
      if (helper.CheckDirectory(*p)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the library.
  return "";
}